

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_shape_fitting.hpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
eos::fitting::fit_shape_to_landmarks_linear
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,PcaModel *shape_model,
          Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *landmarks,vector<int,_std::allocator<int>_> *vertex_ids,VectorXf *base_face,float lambda,
          optional<int> num_coefficients_to_fit,optional<float> detector_standard_deviation,
          optional<float> model_standard_deviation)

{
  Scalar SVar1;
  Matrix<float,_3,_4,_0,_3,_4> *this;
  int blockCols;
  size_type sVar2;
  size_type sVar3;
  Index IVar4;
  VectorXf *other;
  const_reference pvVar5;
  Index IVar6;
  long lVar7;
  Scalar *v;
  DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *pDVar8;
  CoeffReturnType pfVar9;
  Scalar *pSVar10;
  Scalar *__first;
  Scalar *pSVar11;
  float fVar12;
  double dVar13;
  __type_conflict _Var14;
  __type_conflict _Var15;
  Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0> PVar16;
  Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> PVar17;
  allocator<float> local_4f1;
  ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> local_4f0;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  local_458;
  undefined1 local_448 [8];
  VectorXf c_s;
  non_const_type local_430;
  NegativeReturnType local_428;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
  local_418;
  Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
  local_400;
  undefined1 local_3e0 [8];
  MatrixXf rhs;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_3b0;
  Nested local_370;
  non_const_type local_368;
  Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
  local_360;
  Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
  local_350;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
  local_338;
  undefined1 local_2d8 [8];
  MatrixXf AtOmegaAReg;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_2b0;
  undefined1 local_290 [8];
  MatrixXf b;
  undefined1 local_268 [8];
  MatrixXf A;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> local_248 [4];
  int i_3;
  undefined1 local_238 [8];
  VectorXf v_bar;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> local_220 [4];
  int i_2;
  undefined1 local_210 [8];
  VectorXf y;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> local_1f8 [16];
  undefined1 local_1e8 [8];
  VectorXf Omega;
  float local_1d0;
  float local_1cc;
  iterator iStack_1c8;
  float sigma_squared_2D;
  __normal_iterator<Eigen::Triplet<float,_int>_*,_std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>_>
  local_1c0;
  int local_1b8;
  int local_1b4;
  Triplet<float,_int> local_1b0;
  int local_1a4;
  int local_1a0;
  int y_1;
  int x;
  int i_1;
  vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> P_coefficients;
  SparseMatrix<float,_0,_int> P;
  Type local_100;
  MatrixXf local_b8;
  DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *local_a0;
  MatrixXf *basis_rows;
  int i;
  int row_index;
  undefined1 local_78 [8];
  MatrixXf V_hat_h;
  int num_landmarks;
  float local_54;
  int num_coeffs_to_fit;
  float lambda_local;
  VectorXf *base_face_local;
  vector<int,_std::allocator<int>_> *vertex_ids_local;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *landmarks_local;
  Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix_local;
  PcaModel *shape_model_local;
  optional<float> model_standard_deviation_local;
  optional<float> detector_standard_deviation_local;
  optional<int> num_coefficients_to_fit_local;
  
  detector_standard_deviation_local.super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float> =
       (_Optional_base<float,_true,_true>)
       (_Optional_base<float,_true,_true>)
       num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>;
  model_standard_deviation_local = detector_standard_deviation;
  shape_model_local =
       (PcaModel *)
       model_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
       super__Optional_payload_base<float>;
  local_54 = lambda;
  _num_coeffs_to_fit = base_face;
  base_face_local = (VectorXf *)vertex_ids;
  vertex_ids_local = (vector<int,_std::allocator<int>_> *)landmarks;
  landmarks_local =
       (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        *)affine_camera_matrix;
  affine_camera_matrix_local = (Matrix<float,_3,_4,_0,_3,_4> *)shape_model;
  sVar2 = std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::size(landmarks);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)base_face_local);
  if (sVar2 == sVar3) {
    V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
         morphablemodel::PcaModel::get_num_principal_components
                   ((PcaModel *)affine_camera_matrix_local);
    blockCols = std::optional<int>::value_or<int>
                          ((optional<int> *)&detector_standard_deviation_local,
                           (int *)((long)&V_hat_h.
                                          super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_cols + 4));
    sVar2 = std::
            vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ::size((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)vertex_ids_local);
    V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols._0_4_ =
         (int)sVar2;
    IVar4 = Eigen::EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)base_face);
    if (IVar4 == 0) {
      other = morphablemodel::PcaModel::get_mean((PcaModel *)affine_camera_matrix_local);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=(base_face,other);
    }
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((ConstantReturnType *)&i,
               (long)((int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols << 2),(long)blockCols);
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_78,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)&i);
    basis_rows._4_4_ = 0;
    for (basis_rows._0_4_ = 0; this = affine_camera_matrix_local,
        (int)basis_rows <
        (int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols; basis_rows._0_4_ = (int)basis_rows + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)base_face_local,(long)(int)basis_rows
                         );
      morphablemodel::PcaModel::get_rescaled_pca_basis_at_point(&local_b8,(PcaModel *)this,*pvVar5);
      local_a0 = (DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_b8;
      IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_b8);
      Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::block<long,int>
                (&local_100,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_b8,0,0,IVar6,
                 blockCols);
      lVar7 = (long)basis_rows._4_4_;
      IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_78);
      Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::block<int,long>
                ((Type *)&P.m_data.m_allocatedSize,
                 (DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_78,lVar7,0,3,IVar6);
      Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false> *)&P.m_data.m_allocatedSize,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_100);
      basis_rows._4_4_ = basis_rows._4_4_ + 4;
      Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_b8);
    }
    Eigen::SparseMatrix<float,_0,_int>::SparseMatrix
              ((SparseMatrix<float,_0,_int> *)
               &P_coefficients.
                super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)((int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols * 3),
               (long)((int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols << 2));
    std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::vector
              ((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> *)
               &x);
    for (y_1 = 0; y_1 < (int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                             .m_storage.m_cols; y_1 = y_1 + 1) {
      local_1a0 = 0;
      while( true ) {
        lVar7 = (long)local_1a0;
        IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::rows
                          (&affine_camera_matrix->
                            super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
        if (IVar6 <= lVar7) break;
        local_1a4 = 0;
        while( true ) {
          lVar7 = (long)local_1a4;
          IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::cols
                            (&affine_camera_matrix->
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
          if (IVar6 <= lVar7) break;
          local_1b4 = y_1 * 3 + local_1a0;
          local_1b8 = local_1a4 + y_1 * 4;
          v = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1> *)
                         affine_camera_matrix,(long)local_1a0,(long)local_1a4);
          Eigen::Triplet<float,_int>::Triplet(&local_1b0,&local_1b4,&local_1b8,v);
          std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
          push_back((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                     *)&x,&local_1b0);
          local_1a4 = local_1a4 + 1;
        }
        local_1a0 = local_1a0 + 1;
      }
    }
    local_1c0._M_current =
         (Triplet<float,_int> *)
         std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
         begin((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> *)
               &x);
    iStack_1c8 = std::
                 vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
                 end((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                      *)&x);
    Eigen::SparseMatrix<float,0,int>::
    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<float,int>*,std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>>>
              ((SparseMatrix<float,0,int> *)
               &P_coefficients.
                super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c0,
               &stack0xfffffffffffffe38);
    dVar13 = std::sqrt(5.32571209255933e-315);
    local_1d0 = SUB84(dVar13,0);
    fVar12 = std::optional<float>::value_or<float>(&model_standard_deviation_local,&local_1d0);
    _Var14 = std::pow<float,int>(fVar12,2);
    Omega.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0;
    fVar12 = std::optional<float>::value_or<float>
                       ((optional<float> *)&shape_model_local,
                        (float *)((long)&Omega.
                                         super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_rows + 4));
    _Var15 = std::pow<float,int>(fVar12,2);
    local_1cc = (float)(_Var14 + _Var15);
    y.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         1.0 / local_1cc;
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Constant
              (local_1f8,
               (long)((int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols * 3),
               (Scalar *)
               ((long)&y.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows + 4));
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((Matrix<float,_1,1,0,_1,1> *)local_1e8,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_1f8);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones
              (local_220,
               (long)((int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols * 3));
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((Matrix<float,_1,1,0,_1,1> *)local_210,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_220);
    for (v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
              = 0;
        v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <
        (int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
             _4_4_ + 1) {
      pDVar8 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
               std::
               vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                             *)vertex_ids_local,
                            (long)v_bar.
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_);
      pfVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[](pDVar8,0);
      fVar12 = *pfVar9;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_210,
                           (long)(v_bar.
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ * 3));
      *pSVar10 = fVar12;
      pDVar8 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
               std::
               vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
               ::operator[]((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                             *)vertex_ids_local,
                            (long)v_bar.
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_);
      pfVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[](pDVar8,1);
      fVar12 = *pfVar9;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_210,
                           (long)(v_bar.
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ * 3 + 1));
      *pSVar10 = fVar12;
    }
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones
              (local_248,
               (long)((int)V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols << 2));
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((Matrix<float,_1,1,0,_1,1> *)local_238,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_248);
    for (A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
              0; A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
                 _4_4_ < (int)V_hat_h.
                              super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols;
        A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
             A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
             _4_4_ + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)base_face_local,
                          (long)A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols._4_4_);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)base_face,
                           (long)(*pvVar5 * 3));
      SVar1 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_238,
                           (long)(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols._4_4_ << 2));
      *pSVar10 = SVar1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)base_face_local,
                          (long)A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols._4_4_);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)base_face,
                           (long)(*pvVar5 * 3 + 1));
      SVar1 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_238,
                           (long)(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols._4_4_ * 4 + 1));
      *pSVar10 = SVar1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)base_face_local,
                          (long)A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols._4_4_);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)base_face,
                           (long)(*pvVar5 * 3 + 2));
      SVar1 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_238,
                           (long)(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols._4_4_ * 4 + 2));
      *pSVar10 = SVar1;
    }
    PVar16 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                       ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)
                        &P_coefficients.
                         super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_78);
    b.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)PVar16.m_lhs;
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_268,
               (EigenBase<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                *)&b.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols);
    PVar17 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                       ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)
                        &P_coefficients.
                         super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_238);
    AtOmegaAReg.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)PVar17.m_lhs;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,-1,1,0,-1,1>,0>>
    ::operator-(&local_2b0,
                (MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
                 *)&AtOmegaAReg.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_210
               );
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_290,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&local_2b0);
    local_368 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_268);
    local_370 = (Nested)Eigen::MatrixBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::asDiagonal
                                  ((MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_1e8);
    local_360 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>>::
                operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>> *)
                          &local_368,
                          (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                           *)&local_370);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>>
    ::operator*(&local_350,
                (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>>
                 *)&local_360,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_268);
    Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Identity
              ((IdentityReturnType *)
               &rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
               ,(long)blockCols,(long)blockCols);
    Eigen::operator*(&local_3b0,&local_54,
                     (StorageBaseType *)
                     &rhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>,Eigen::Matrix<float,-1,-1,0,-1,-1>,0>>
    ::operator+(&local_338,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                 *)&local_350,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                 *)&local_3b0);
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>const>const>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_2d8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>_>
                *)&local_338);
    local_430 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_268);
    Eigen::DenseBase<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::operator-
              (&local_428,
               (DenseBase<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)
               &local_430);
    c_s.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)Eigen::MatrixBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::asDiagonal
                          ((MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_1e8);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const>>
    ::operator*(&local_418,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>>
                 *)&local_428,
                (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                 *)&c_s.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>>
    ::operator*(&local_400,
                (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>>
                 *)&local_418,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_290);
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_3e0,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                *)&local_400);
    Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::colPivHouseholderQr
              (&local_4f0,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_2d8);
    local_458 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::
                solve<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                          ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                            *)&local_4f0,
                           (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_3e0);
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((Matrix<float,_1,1,0,_1,1> *)local_448,
               (EigenBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)&local_458);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              (&local_4f0);
    __first = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                        ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_448);
    pSVar11 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                        ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_448);
    IVar4 = Eigen::EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_448);
    std::allocator<float>::allocator(&local_4f1);
    std::vector<float,std::allocator<float>>::vector<float_const*,void>
              ((vector<float,std::allocator<float>> *)__return_storage_ptr__,__first,pSVar11 + IVar4
               ,&local_4f1);
    std::allocator<float>::~allocator(&local_4f1);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_448);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_3e0);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_2d8);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_290);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_268);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_238);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_210);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_1e8);
    std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::~vector
              ((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> *)
               &x);
    Eigen::SparseMatrix<float,_0,_int>::~SparseMatrix
              ((SparseMatrix<float,_0,_int> *)
               &P_coefficients.
                super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_78);
    return __return_storage_ptr__;
  }
  __assert_fail("landmarks.size() == vertex_ids.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/linear_shape_fitting.hpp"
                ,0x44,
                "std::vector<float> eos::fitting::fit_shape_to_landmarks_linear(const morphablemodel::PcaModel &, Eigen::Matrix<float, 3, 4>, const std::vector<Eigen::Vector2f> &, const std::vector<int> &, Eigen::VectorXf, float, cpp17::optional<int>, cpp17::optional<float>, cpp17::optional<float>)"
               );
}

Assistant:

inline std::vector<float> fit_shape_to_landmarks_linear(
    const morphablemodel::PcaModel& shape_model, Eigen::Matrix<float, 3, 4> affine_camera_matrix,
    const std::vector<Eigen::Vector2f>& landmarks, const std::vector<int>& vertex_ids,
    Eigen::VectorXf base_face = Eigen::VectorXf(), float lambda = 3.0f,
    cpp17::optional<int> num_coefficients_to_fit = cpp17::optional<int>(),
    cpp17::optional<float> detector_standard_deviation = cpp17::optional<float>(),
    cpp17::optional<float> model_standard_deviation = cpp17::optional<float>())
{
    assert(landmarks.size() == vertex_ids.size());

    using Eigen::VectorXf;
    using Eigen::MatrixXf;

    const int num_coeffs_to_fit = num_coefficients_to_fit.value_or(shape_model.get_num_principal_components());
    const int num_landmarks = static_cast<int>(landmarks.size());

    if (base_face.size() == 0)
    {
        base_face = shape_model.get_mean();
    }

    // $\hat{V} \in R^{3N\times m-1}$, subselect the rows of the eigenvector matrix $V$ associated with the $N$ feature points
    // And we insert a row of zeros after every third row, resulting in matrix $\hat{V}_h \in R^{4N\times m-1}$:
    MatrixXf V_hat_h = MatrixXf::Zero(4 * num_landmarks, num_coeffs_to_fit);
    int row_index = 0;
    for (int i = 0; i < num_landmarks; ++i)
    {
        // In the paper, I'm not sure whether they use the orthonormal basis. It seems a bit messy/inconsistent even in the paper.
        // Update PH 26.5.2014: I think the rescaled basis is fine/better!
        const auto& basis_rows = shape_model.get_rescaled_pca_basis_at_point(vertex_ids[i]);
        V_hat_h.block(row_index, 0, 3, V_hat_h.cols()) =
            basis_rows.block(0, 0, basis_rows.rows(), num_coeffs_to_fit);
        row_index += 4; // replace 3 rows and skip the 4th one, it has all zeros
    }

    // Form a block diagonal matrix $P \in R^{3N\times 4N}$ in which the camera matrix C (P_Affine, affine_camera_matrix) is placed on the diagonal:
    Eigen::SparseMatrix<float> P(3 * num_landmarks, 4 * num_landmarks);
    std::vector<Eigen::Triplet<float>> P_coefficients; // list of non-zeros coefficients
    for (int i = 0; i < num_landmarks; ++i) { // Note: could make this the inner-most loop.
        for (int x = 0; x < affine_camera_matrix.rows(); ++x) {
            for (int y = 0; y < affine_camera_matrix.cols(); ++y) {
                P_coefficients.push_back(
                    Eigen::Triplet<float>(3 * i + x, 4 * i + y, affine_camera_matrix(x, y)));
            }
        }
    }
    P.setFromTriplets(P_coefficients.begin(), P_coefficients.end());

    // The variances: Add the 2D and 3D standard deviations.
    // If the user doesn't provide them, we choose the following:
    // 2D (detector) standard deviation: In pixel, we follow [1] and choose sqrt(3) as the default value.
    // 3D (model) variance: 0.0f. It only makes sense to set it to something when we have a different variance
    // for different vertices.
    // The 3D variance has to be projected to 2D (for details, see paper [1]) so the units do match up.
    const float sigma_squared_2D = std::pow(detector_standard_deviation.value_or(std::sqrt(3.0f)), 2) +
                                   std::pow(model_standard_deviation.value_or(0.0f), 2);
    // We use a VectorXf, and later use .asDiagonal():
    const VectorXf Omega = VectorXf::Constant(3 * num_landmarks, 1.0f / sigma_squared_2D);
    // Earlier, we set Sigma in a for-loop and then computed Omega, but it was really unnecessary:
    // Sigma(i, i) = sqrt(sigma_squared_2D), but then Omega is Sigma.t() * Sigma (squares the diagonal) - so
    // we just assign 1/sigma_squared_2D to Omega here.

    // The landmarks in matrix notation (in homogeneous coordinates), $3N\times 1$
    VectorXf y = VectorXf::Ones(3 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        y(3 * i) = landmarks[i][0];
        y((3 * i) + 1) = landmarks[i][1];
        // y((3 * i) + 2) = 1; // already 1, stays (homogeneous coordinate)
    }

    // The mean, with an added homogeneous coordinate (x_1, y_1, z_1, 1, x_2, ...)^t
    VectorXf v_bar = VectorXf::Ones(4 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        v_bar(4 * i) = base_face(vertex_ids[i] * 3);
        v_bar((4 * i) + 1) = base_face(vertex_ids[i] * 3 + 1);
        v_bar((4 * i) + 2) = base_face(vertex_ids[i] * 3 + 2);
        // v_bar((4 * i) + 3) = 1; // already 1, stays (homogeneous coordinate)
    }

    // Bring into standard regularised quadratic form with diagonal distance matrix Omega:
    const MatrixXf A = P * V_hat_h; // camera matrix times the basis
    const MatrixXf b = P * v_bar - y; // camera matrix times the mean, minus the landmarks
    const MatrixXf AtOmegaAReg = A.transpose() * Omega.asDiagonal() * A +
                                 lambda * Eigen::MatrixXf::Identity(num_coeffs_to_fit, num_coeffs_to_fit);
    const MatrixXf rhs = -A.transpose() * Omega.asDiagonal() * b; // It's -A^t*Omega^t*b, but we don't need to
                                                                  // transpose Omega, since it's a diagonal
                                                                  // matrix, and Omega^t = Omega.

    // c_s: The 'x' that we solve for. (The variance-normalised shape parameter vector, $c_s =
    // [a_1/sigma_{s,1} , ..., a_m-1/sigma_{s,m-1}]^t$.)
    // We get coefficients ~ N(0, 1), because we're fitting with the rescaled basis. The coefficients are not
    // multiplied with their eigenvalues.
    const VectorXf c_s = AtOmegaAReg.colPivHouseholderQr().solve(rhs);

    return std::vector<float>(c_s.data(), c_s.data() + c_s.size());
}